

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

bool __thiscall ON_LineCurve::Trim(ON_LineCurve *this,ON_Interval *domain)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  ON_3dPoint q;
  ON_3dPoint p;
  
  bVar2 = ON_Interval::IsIncreasing(domain);
  if (bVar2) {
    bVar2 = false;
    bVar3 = ON_Interval::Includes(&this->m_t,domain,false);
    if (bVar3) {
      dVar1 = ON_Interval::operator[](domain,0);
      ON_Curve::PointAt(&p,&this->super_ON_Curve,dVar1);
      dVar1 = ON_Interval::operator[](domain,1);
      ON_Curve::PointAt(&q,&this->super_ON_Curve,dVar1);
      bVar2 = ON_3dPoint::IsCoincident(&p,&q);
      if (!bVar2) {
        (this->m_line).from.z = p.z;
        (this->m_line).from.x = p.x;
        (this->m_line).from.y = p.y;
        (this->m_line).to.z = q.z;
        (this->m_line).to.x = q.x;
        (this->m_line).to.y = q.y;
        dVar1 = domain->m_t[1];
        (this->m_t).m_t[0] = domain->m_t[0];
        (this->m_t).m_t[1] = dVar1;
        ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      }
      bVar2 = !bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_LineCurve::Trim( const ON_Interval& domain )
{
  bool rc = false;
  if ( domain.IsIncreasing() && m_t.Includes(domain) )
  {
    ON_3dPoint p = PointAt( domain[0] );
    ON_3dPoint q = PointAt( domain[1] );
		if( !p.IsCoincident(q)){			
      // 7-May-21 GBA, A successful trim should return an IsValid ON_LineCurve .
			m_line.from = p;
			m_line.to = q;
			m_t = domain;
      DestroyCurveTree();
			rc = true;
		}
  }
  return rc;
}